

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture2D_GL.cpp
# Opt level: O3

void __thiscall
Diligent::Texture2D_GL::Texture2D_GL
          (Texture2D_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,TextureData *pInitData,bool bIsDeviceInternal
          )

{
  GLTextureObj *TexObj;
  Uint32 UVar1;
  uint uVar2;
  uint uVar3;
  GLenum GVar4;
  long lVar5;
  ulong uVar6;
  GLenum err;
  uint local_5c;
  undefined1 local_58 [8];
  UniqueIdHelper<GLObjectWrappers::GLTextureCreateReleaseHelper> local_50;
  Uint32 local_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *local_38;
  
  GVar4 = 0xde1;
  if (1 < TexDesc->SampleCount) {
    GVar4 = 0x9100;
  }
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,TexDesc,GVar4,
             pInitData,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_00af3638;
  if (TexDesc->Usage == USAGE_STAGING) {
    return;
  }
  TexObj = &(this->super_TextureBaseGL).m_GlTexture;
  GLContextState::BindTexture(GLState,-1,(this->super_TextureBaseGL).m_BindTarget,TexObj);
  uVar2 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          .m_Desc.SampleCount;
  GVar4 = (this->super_TextureBaseGL).m_BindTarget;
  local_38 = TexObj;
  if (uVar2 < 2) {
    (*__glewTexStorage2D)
              (GVar4,(this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.MipLevels,(this->super_TextureBaseGL).m_GLTexFormat,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Width,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Height);
    local_58._0_4_ = glGetError();
    if (local_58._0_4_ != 0) {
      LogError<true,char[46],char[17],unsigned_int>
                (false,"Texture2D_GL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x5e,(char (*) [46])"Failed to allocate storage for the 2D texture",
                 (char (*) [17])"\nGL Error Code: ",(uint *)local_58);
    }
    TextureBaseGL::SetDefaultGLParameters(&this->super_TextureBaseGL);
    if ((pInitData == (TextureData *)0x0) || (pInitData->pSubResources == (TextureSubResData *)0x0))
    goto LAB_003119a9;
    UVar1 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.MipLevels;
    if (UVar1 == pInitData->NumSubresources) {
      if (UVar1 != 0) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          uVar2 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  .m_Desc.Width >> ((byte)uVar6 & 0x1f);
          uVar3 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  .m_Desc.Height >> ((byte)uVar6 & 0x1f);
          local_4c = uVar3 + (uVar3 == 0);
          local_58 = (undefined1  [8])((ulong)(uVar2 + (uVar2 == 0)) << 0x20);
          local_50.m_ID = 0;
          local_48._M_allocated_capacity = 0x100000000;
          UpdateData(this,GLState,(Uint32)uVar6,0,(Box *)local_58,
                     (TextureSubResData *)((long)&pInitData->pSubResources->pData + lVar5));
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x28;
        } while (uVar6 < (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>
                         .
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         .m_Desc.MipLevels);
      }
      goto LAB_003119a9;
    }
    FormatString<char[33]>((string *)local_58,(char (*) [33])"Incorrect number of subresources");
    DebugAssertionFailed
              ((Char *)local_58,"Texture2D_GL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
               ,0x7a);
  }
  else {
    (*__glewTexStorage2DMultisample)
              (GVar4,uVar2,(this->super_TextureBaseGL).m_GLTexFormat,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Width,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Height,'\x01');
    local_58._0_4_ = glGetError();
    if (local_58._0_4_ != 0) {
      LogError<true,char[58],char[17],unsigned_int>
                (false,"Texture2D_GL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x4c,(char (*) [58])"Failed to allocate storage for the 2D multisample texture",
                 (char (*) [17])"\nGL Error Code: ",(uint *)local_58);
    }
    TextureBaseGL::SetDefaultGLParameters(&this->super_TextureBaseGL);
    if ((pInitData == (TextureData *)0x0) || (pInitData->pSubResources == (TextureSubResData *)0x0))
    goto LAB_003119a9;
    FormatString<char[50]>
              ((string *)local_58,(char (*) [50])"Multisampled textures cannot be modified directly"
              );
    DebugAssertionFailed
              ((Char *)local_58,"Texture2D_GL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
               ,0x55);
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
LAB_003119a9:
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::SetName
            (local_38,(this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                      .m_Desc.super_DeviceObjectAttribs.Name);
  local_58 = (undefined1  [8])0x0;
  local_50.m_ID = 0;
  GLContextState::BindTexture
            (GLState,-1,(this->super_TextureBaseGL).m_BindTarget,(GLTextureObj *)local_58);
  if (local_58._0_4_ != 0) {
    local_5c = local_58._0_4_;
    if (local_58._4_4_ == 0) {
      glDeleteTextures(1,&local_5c);
    }
  }
  return;
}

Assistant:

Texture2D_GL::Texture2D_GL(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& TexViewObjAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           GLContextState&            GLState,
                           const TextureDesc&         TexDesc,
                           const TextureData*         pInitData /*= nullptr*/,
                           bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        static_cast<GLenum>(TexDesc.SampleCount > 1 ? GL_TEXTURE_2D_MULTISAMPLE : GL_TEXTURE_2D),
        pInitData,
        bIsDeviceInternal
    }
// clang-format on
{
    if (TexDesc.Usage == USAGE_STAGING)
    {
        // We will use PBO initialized by TextureBaseGL
        return;
    }

    GLState.BindTexture(-1, m_BindTarget, m_GlTexture);

    if (m_Desc.SampleCount > 1)
    {
#if GL_ARB_texture_storage_multisample
        //                                               format          width          height         depth
        glTexStorage2DMultisample(m_BindTarget, m_Desc.SampleCount, m_GLTexFormat, m_Desc.Width, m_Desc.Height, GL_TRUE);
        // The last parameter specifies whether the image will use identical sample locations and the same number of
        // samples for all texels in the image, and the sample locations will not depend on the internal format or size
        // of the image.
        DEV_CHECK_GL_ERROR_AND_THROW("Failed to allocate storage for the 2D multisample texture");
        // * An INVALID_ENUM error is generated if sizedinternalformat is not colorrenderable,
        //   depth - renderable, or stencil - renderable
        // * An INVALID_OPERATION error is generated if samples is greater than the maximum number of samples
        //   supported for this target and internalformat. The maximum number of samples supported can be
        //   determined by calling glGetInternalformativ with a pname of GL_SAMPLES

        SetDefaultGLParameters();

        VERIFY(pInitData == nullptr || pInitData->pSubResources == nullptr, "Multisampled textures cannot be modified directly");
#else
        LOG_ERROR_AND_THROW("Multisampled textures are not supported");
#endif
    }
    else
    {
        //                             levels             format          width         height
        glTexStorage2D(m_BindTarget, m_Desc.MipLevels, m_GLTexFormat, m_Desc.Width, m_Desc.Height);
        DEV_CHECK_GL_ERROR_AND_THROW("Failed to allocate storage for the 2D texture");
        // When target is GL_TEXTURE_2D, calling glTexStorage2D is equivalent to the following pseudo-code:
        //for (i = 0; i < levels; i++)
        //{
        //    glTexImage2D(target, i, internalformat, width, height, 0, format, type, NULL);
        //    width = max(1, (width / 2));
        //    height = max(1, (height / 2));
        //}

        SetDefaultGLParameters();

        if (pInitData != nullptr && pInitData->pSubResources != nullptr)
        {
            if (m_Desc.MipLevels == pInitData->NumSubresources)
            {
                for (Uint32 Mip = 0; Mip < m_Desc.MipLevels; ++Mip)
                {
                    Box DstBox{0, std::max(m_Desc.Width >> Mip, 1U),
                               0, std::max(m_Desc.Height >> Mip, 1U)};
                    // UpdateData() is a virtual function. If we try to call it through vtbl from here,
                    // we will get into TextureBaseGL::UpdateData(), because instance of Texture2D_GL
                    // is not fully constructed yet.
                    // To call the required function, we need to explicitly specify the class:
                    Texture2D_GL::UpdateData(GLState, Mip, 0, DstBox, pInitData->pSubResources[Mip]);
                }
            }
            else
            {
                UNEXPECTED("Incorrect number of subresources");
            }
        }
    }

    m_GlTexture.SetName(m_Desc.Name);

    GLState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}